

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::FindVCChannels
          (LWOImporter *this,Surface *surf,SortedRep *sorted,Layer *layer,uint *out)

{
  uint uVar1;
  size_t __n;
  pointer pFVar2;
  pointer pfVar3;
  int iVar4;
  Logger *this_00;
  long *plVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  string *__rhs;
  long *plVar9;
  pointer pVVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long *local_78;
  long local_68;
  long lStack_60;
  SortedRep *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVVar10 = (layer->mVColorChannels).
            super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((layer->mVColorChannels).
      super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
      _M_impl.super__Vector_impl_data._M_finish == pVVar10) {
    uVar14 = 0;
  }
  else {
    uVar7 = 0;
    uVar14 = 0;
    local_58 = sorted;
    do {
      __rhs = &pVVar10[uVar7].super_VMapEntry.name;
      __n = (surf->mVCMap)._M_string_length;
      uVar11 = (uint)uVar7;
      if ((__n == pVVar10[uVar7].super_VMapEntry.name._M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp((surf->mVCMap)._M_dataplus._M_p,(__rhs->_M_dataplus)._M_p,__n), iVar4 == 0))
         )) {
        if (uVar14 != 0) {
          uVar7 = 7;
          if (uVar14 < 7) {
            uVar7 = (ulong)uVar14;
          }
          uVar1 = *out;
          uVar8 = 0;
          do {
            out[uVar8 + 1] = uVar1;
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        *out = uVar11;
        uVar14 = uVar14 + 1;
      }
      else {
        puVar6 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar6 != (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish) {
          do {
            pFVar2 = (layer->mFaces).
                     super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar8 = (ulong)pFVar2[*puVar6].super_aiFace.mNumIndices;
            if (uVar8 != 0) {
              uVar12 = 0;
              do {
                uVar1 = pFVar2[*puVar6].super_aiFace.mIndices[uVar12];
                uVar13 = (ulong)uVar1;
                if ((pVVar10[uVar7].super_VMapEntry.abAssigned.
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >> (uVar13 & 0x3f) & 1) != 0
                   ) {
                  pfVar3 = pVVar10[uVar7].super_VMapEntry.rawData.
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if (((((pfVar3[uVar13 * 4] != 0.0) || (NAN(pfVar3[uVar13 * 4]))) ||
                       (pfVar3[uVar13 * 4 + 1] != 0.0)) ||
                      ((NAN(pfVar3[uVar13 * 4 + 1]) || (pfVar3[uVar13 * 4 + 2] != 0.0)))) ||
                     ((NAN(pfVar3[uVar13 * 4 + 2]) ||
                      ((pfVar3[uVar13 * 4 + 3] != 1.0 || (NAN(pfVar3[uVar13 * 4 + 3]))))))) {
                    if (uVar14 < 8) {
                      uVar8 = (ulong)uVar14;
                      uVar14 = uVar14 + 1;
                      out[uVar8] = uVar11;
                    }
                    else {
                      this_00 = DefaultLogger::get();
                      std::operator+(&local_50,
                                     "LWO: Maximum number of vertex color channels for this mesh reached. Skipping channel \'"
                                     ,__rhs);
                      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
                      local_78 = &local_68;
                      plVar9 = plVar5 + 2;
                      if ((long *)*plVar5 == plVar9) {
                        local_68 = *plVar9;
                        lStack_60 = plVar5[3];
                      }
                      else {
                        local_68 = *plVar9;
                        local_78 = (long *)*plVar5;
                      }
                      *plVar5 = (long)plVar9;
                      plVar5[1] = 0;
                      *(undefined1 *)(plVar5 + 2) = 0;
                      Logger::error(this_00,(char *)local_78);
                      if (local_78 != &local_68) {
                        operator_delete(local_78);
                      }
                      sorted = local_58;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p);
                      }
                    }
                    puVar6 = (sorted->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish + -1;
                    break;
                  }
                }
                uVar12 = uVar12 + 1;
              } while (uVar8 != uVar12);
            }
            puVar6 = puVar6 + 1;
          } while (puVar6 != (sorted->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      uVar7 = (ulong)(uVar11 + 1);
      pVVar10 = (layer->mVColorChannels).
                super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(layer->mVColorChannels).
                     super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 4) *
              0x6db6db6db6db6db7;
    } while (uVar7 <= uVar8 && uVar8 - uVar7 != 0);
  }
  if (uVar14 != 8) {
    out[uVar14] = 0xffffffff;
  }
  return;
}

Assistant:

void LWOImporter::FindVCChannels(const LWO::Surface& surf, LWO::SortedRep& sorted, const LWO::Layer& layer,
    unsigned int out[AI_MAX_NUMBER_OF_COLOR_SETS])
{
    unsigned int next = 0;

    // Check whether we have an vc entry != 0 for one of the faces in 'sorted'
    for (unsigned int i = 0; i < layer.mVColorChannels.size();++i)  {
        const LWO::VColorChannel& vc = layer.mVColorChannels[i];

        if (surf.mVCMap == vc.name) {
            // The vertex color map is explicitly requested by the surface so we need to take special care of it
            for (unsigned int a = 0; a < std::min(next,AI_MAX_NUMBER_OF_COLOR_SETS-1u); ++a) {
                out[a+1] = out[a];
            }
            out[0] = i;
            ++next;
        }
        else {

            for (LWO::SortedRep::iterator it = sorted.begin(); it != sorted.end(); ++it)    {
                const LWO::Face& face = layer.mFaces[*it];

                for (unsigned int n = 0; n < face.mNumIndices; ++n) {
                    unsigned int idx = face.mIndices[n];

                    if (vc.abAssigned[idx] && ((aiColor4D*)&vc.rawData[0])[idx] != aiColor4D(0.0,0.0,0.0,1.0)) {
                        if (next >= AI_MAX_NUMBER_OF_COLOR_SETS) {

                            ASSIMP_LOG_ERROR("LWO: Maximum number of vertex color channels for "
                                "this mesh reached. Skipping channel \'" + vc.name + "\'");

                        }
                        else {
                            out[next++] = i;
                        }
                        it = sorted.end()-1;
                        break;
                    }
                }
            }
        }
    }
    if (next != AI_MAX_NUMBER_OF_COLOR_SETS) {
        out[next] = UINT_MAX;
    }
}